

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_psllw_mips(uint64_t fs,uint64_t ft)

{
  uint local_2c;
  uint64_t uStack_28;
  uint i;
  LMIValue vs;
  uint64_t ft_local;
  uint64_t fs_local;
  
  if ((ft & 0x7f) < 0x20) {
    uStack_28 = fs;
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      *(int *)((long)&stack0xffffffffffffffd8 + (ulong)local_2c * 4) =
           *(int *)((long)&stack0xffffffffffffffd8 + (ulong)local_2c * 4) <<
           ((byte)(ft & 0x7f) & 0x1f);
    }
    fs_local = uStack_28;
  }
  else {
    fs_local = 0;
  }
  return fs_local;
}

Assistant:

uint64_t helper_psllw(uint64_t fs, uint64_t ft)
{
    LMIValue vs;
    unsigned i;

    ft &= 0x7f;
    if (ft > 31) {
        return 0;
    }
    vs.d = fs;
    for (i = 0; i < 2; ++i) {
        vs.uw[i] <<= ft;
    }
    return vs.d;
}